

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O1

tuple<int,_int,_int> __thiscall
Display::getMaximumFieldsize(Display *this,int window_width,int window_height,int mine_count)

{
  _Head_base<0UL,_int,_false> _Var1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  runtime_error *this_00;
  long *plVar6;
  size_type *psVar7;
  int iVar8;
  int iVar9;
  tuple<int,_int,_int> tVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar3 = getMaxTextWidth(mine_count);
  if (iVar3 < 2) {
    iVar3 = 1;
  }
  if ((window_height < 4) || (window_width <= iVar3)) {
    iVar4 = getMaxTextWidth(mine_count);
    iVar3 = 1;
    if (1 < iVar4) {
      iVar3 = iVar4;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_d0,window_width);
    std::operator+(&local_b0,"Can\'t display any minefield on this size (",&local_d0);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_190._M_dataplus._M_p = (pointer)*plVar6;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_190._M_dataplus._M_p == psVar7) {
      local_190.field_2._M_allocated_capacity = *psVar7;
      local_190.field_2._8_8_ = plVar6[3];
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    }
    else {
      local_190.field_2._M_allocated_capacity = *psVar7;
    }
    local_190._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::to_string(&local_f0,window_height);
    std::operator+(&local_90,&local_190,&local_f0);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_170._M_dataplus._M_p = (pointer)*plVar6;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_170._M_dataplus._M_p == psVar7) {
      local_170.field_2._M_allocated_capacity = *psVar7;
      local_170.field_2._8_8_ = plVar6[3];
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    }
    else {
      local_170.field_2._M_allocated_capacity = *psVar7;
    }
    local_170._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::to_string(&local_110,iVar3 + 1);
    std::operator+(&local_70,&local_170,&local_110);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_150._M_dataplus._M_p = (pointer)*plVar6;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_150._M_dataplus._M_p == psVar7) {
      local_150.field_2._M_allocated_capacity = *psVar7;
      local_150.field_2._8_8_ = plVar6[3];
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar7;
    }
    local_150._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::to_string(&local_130,4);
    std::operator+(&local_50,&local_150,&local_130);
    std::runtime_error::runtime_error(this_00,(string *)&local_50);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = 2;
  do {
    iVar9 = iVar3;
    iVar4 = getMaxTextWidth(mine_count);
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    iVar3 = iVar9 + 1;
  } while ((iVar9 + 2 <= window_height) && (iVar4 < window_width));
  iVar4 = 1;
  do {
    iVar5 = iVar4;
    iVar8 = iVar5 * 2 + -1;
    iVar4 = getMaxTextWidth(mine_count);
    if (iVar8 < iVar4) {
      iVar8 = iVar4;
    }
  } while ((iVar3 <= window_height) && (iVar4 = iVar5 + 1, iVar8 < window_width));
  _Var1._M_head_impl = iVar9 + -2;
  iVar8 = iVar5 + -1;
  iVar9 = iVar5 * 2 + -3;
  iVar4 = getMaxTextWidth(mine_count);
  if (iVar4 <= iVar9) {
    iVar4 = iVar9;
  }
  if ((iVar3 <= window_height) && (iVar4 < window_width)) {
    iVar4 = 1;
    while ((mine_count <= iVar8 * _Var1._M_head_impl && (iVar4 - 1U < 9))) {
      dVar2 = pow(10.0,(double)iVar4);
      mine_count = (int)dVar2;
      iVar5 = getMaxTextWidth(mine_count);
      if (iVar5 <= iVar9) {
        iVar5 = iVar9;
      }
      if ((window_height < iVar3) || (iVar4 = iVar4 + 1, window_width <= iVar5)) break;
    }
  }
  iVar3 = iVar8 * _Var1._M_head_impl;
  if (mine_count + -1 < iVar8 * _Var1._M_head_impl) {
    iVar3 = mine_count + -1;
  }
  *(int *)&(this->controller).mfield.mines.
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start = iVar3;
  *(int *)((long)&(this->controller).mfield.mines.
                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4) = _Var1._M_head_impl;
  *(int *)&(this->controller).mfield.mines.
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish = iVar8;
  tVar10.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       _Var1._M_head_impl;
  tVar10.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> =
       (_Tuple_impl<1UL,_int,_int>)this;
  return (tuple<int,_int,_int>)tVar10.super__Tuple_impl<0UL,_int,_int,_int>;
}

Assistant:

std::tuple<int, int, int> Display::getMaximumFieldsize(int window_width, int window_height, int mine_count) {
    int width = 1;
    int height = 1;
    int count = mine_count;

    if (! isWindowSizeSufficient(width, height, count, window_width, window_height)) {
        int required_width, required_height;
        std::tie(required_width, required_height) = Display::getRequiredWindowSize(width, height, count);
        throw std::runtime_error("Can't display any minefield on this size (" + std::to_string(window_width) + "x" + std::to_string(window_height) + "), minimum required: " + std::to_string(required_width) + "x" + std::to_string(required_height));
    }

    // get max y
    while (isWindowSizeSufficient(width, height, count, window_width, window_height)) {
        height++;
    }
    // height is now one too much
    height--;

    // get max x
    while (isWindowSizeSufficient(width, height, count, window_width, window_height)) {
        width++;
    }
    // width is now one too much
    width--;

    // now get max. minecount
    
    int exponent = 0;
    while (isWindowSizeSufficient(width, height, count, window_width, window_height) && count <= width * height) {
        exponent++;
        if (std::numeric_limits<int>::digits10 < exponent) {
            break;
        }
        count = std::pow(10, exponent);
    }
    // remove one decimal digit -> is OK
    count--;
    if (count > width * height) {
        count = width * height;
    }

    return std::make_tuple(width, height, count);
}